

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t exr_attr_string_init(exr_context_t ctxt,exr_attr_string_t *s,int32_t len)

{
  undefined8 uVar1;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  exr_attr_string_t nil;
  undefined8 local_30;
  undefined8 local_28;
  int local_1c;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_30,0,0x10);
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_1c < 0) {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,"Received request to allocate negative sized string (%d)",
                         local_1c);
  }
  else if (local_18 == (int *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid reference to string object to initialize");
  }
  else {
    *(undefined8 *)local_18 = local_30;
    *(undefined8 *)(local_18 + 2) = local_28;
    uVar1 = (**(code **)(local_10 + 0x58))((long)(local_1c + 1));
    *(undefined8 *)(local_18 + 2) = uVar1;
    if (*(long *)(local_18 + 2) == 0) {
      local_4 = (**(code **)(local_10 + 0x38))(local_10,1);
    }
    else {
      *local_18 = local_1c;
      local_18[1] = local_1c + 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_init (exr_context_t ctxt, exr_attr_string_t* s, int32_t len)
{
    exr_attr_string_t nil = {0};
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (len < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string (%d)",
            len);

    if (!s)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string object to initialize");

    *s     = nil;
    s->str = (char*) ctxt->alloc_fn ((size_t) (len + 1));
    if (s->str == NULL)
        return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
    s->length     = len;
    s->alloc_size = len + 1;
    return EXR_ERR_SUCCESS;
}